

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtr_mgr.c
# Opt level: O0

int rtr_mgr_add_aspa_support(rtr_mgr_config *config,aspa_update_fp aspa_update_fp)

{
  long lVar1;
  aspa_table *aspa_table_00;
  long in_FS_OFFSET;
  aspa_table *aspa_table;
  aspa_update_fp aspa_update_fp_local;
  rtr_mgr_config *config_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (config == (rtr_mgr_config *)0x0) {
    config_local._4_4_ = -1;
  }
  else {
    aspa_table_00 = (aspa_table *)lrtr_malloc(0x80);
    if (aspa_table_00 == (aspa_table *)0x0) {
      config_local._4_4_ = -1;
    }
    else {
      aspa_table_init(aspa_table_00,aspa_update_fp);
      config->aspa_table = aspa_table_00;
      config_local._4_4_ = 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return config_local._4_4_;
  }
  __stack_chk_fail();
}

Assistant:

RTRLIB_EXPORT int rtr_mgr_add_aspa_support(struct rtr_mgr_config *config, const aspa_update_fp aspa_update_fp)
{
	if (config == NULL) {
		return RTR_ERROR;
	}

	/* Init aspa table that we need to pass to the sockets */
	struct aspa_table *aspa_table = lrtr_malloc(sizeof(*aspa_table));
	if (!aspa_table) {
		return RTR_ERROR;
	}

	aspa_table_init(aspa_table, aspa_update_fp);
	config->aspa_table = aspa_table;

	return RTR_SUCCESS;
}